

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.h
# Opt level: O0

cmCommand * __thiscall cmMessageCommand::Clone(cmMessageCommand *this)

{
  cmCommand *this_00;
  cmMessageCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmMessageCommand((cmMessageCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmMessageCommand;
    }